

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetricsDiscoveryHelper.cpp
# Opt level: O1

void __thiscall
MetricsDiscovery::MDHelper::OpenStream
          (MDHelper *this,uint32_t timerPeriod,uint32_t bufferSize,uint32_t pid)

{
  int iVar1;
  long lVar2;
  uint32_t numReports;
  vector<char,_std::allocator<char>_> reportData;
  uint32_t local_34;
  uint32_t local_30 [2];
  vector<char,_std::allocator<char>_> local_28;
  
  if ((((this->m_Initialized == true) && (this->m_ConcurrentGroup != (IConcurrentGroupLatest *)0x0))
      && (this->m_MetricSet != (IMetricSetLatest *)0x0)) && ((this->m_APIMask & 1) != 0)) {
    local_34 = bufferSize;
    local_30[0] = timerPeriod;
    if (bufferSize == 0) {
      lVar2 = (**(code **)(*(long *)this->m_MetricsDevice + 0x28))
                        (this->m_MetricsDevice,"OABufferMaxSize");
      if (lVar2 == 0) {
        local_34 = 0x400000;
      }
      else {
        local_34 = *(uint32_t *)(lVar2 + 8);
      }
    }
    iVar1 = (**(code **)(*(long *)this->m_ConcurrentGroup + 0x20))
                      (this->m_ConcurrentGroup,this->m_MetricSet,pid,local_30,&local_34);
    if (iVar1 == 0) {
      lVar2 = (**(code **)(*(long *)this->m_MetricSet + 0x10))();
      local_28.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_28.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_28.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::vector<char,_std::allocator<char>_>::resize(&local_28,(ulong)*(uint *)(lVar2 + 0x18));
      local_30[1] = 1;
      (**(code **)(*(long *)this->m_ConcurrentGroup + 0x28))
                (this->m_ConcurrentGroup,local_30 + 1,
                 local_28.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,1);
      if (local_28.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_28.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
  }
  return;
}

Assistant:

void MDHelper::OpenStream( uint32_t timerPeriod, uint32_t bufferSize, uint32_t pid )
{
    if( !m_Initialized || !m_ConcurrentGroup || !m_MetricSet )
    {
        DebugPrint("Can't OpenStream!\n");
        return;
    }

    if( !( m_APIMask & API_TYPE_IOSTREAM ) )
    {
        DebugPrint("OpenStream requires API_TYPE_IOSTREAM!\n");
        return;
    }

    if( bufferSize == 0 )
    {
        TTypedValueLatest* oaBufferSize = m_MetricsDevice->
            GetGlobalSymbolValueByName( "OABufferMaxSize" );
        if( oaBufferSize )
        {
            bufferSize = oaBufferSize->ValueUInt32;
            DebugPrint("Trying device maximum buffer size = %u bytes.\n", bufferSize);
        }
        else
        {
            bufferSize = 4 * 1024 * 1024;   // 4MB
            DebugPrint("Trying default maximum buffer size = %u bytes.\n", bufferSize);
        }
    }

    TCompletionCode res = m_ConcurrentGroup->OpenIoStream(
        m_MetricSet,
        pid,
        &timerPeriod,
        &bufferSize );
    if( res != CC_OK )
    {
        DebugPrint("OpenIoStream failed %d\n", res);
        return;
    }
    else
    {
        DebugPrint("OpenIoStream succeeded: timer period = %u ns, buffer size = %u bytes.\n",
            timerPeriod,
            bufferSize);
    }

    // Read a dummy report from the stream, to populate the metric names and units.
    const uint32_t  reportSize = m_MetricSet->GetParams()->RawReportSize;

    std::vector<char>   reportData;
    reportData.resize( reportSize );

    uint32_t    numReports = 1;
    res = m_ConcurrentGroup->ReadIoStream(
        &numReports,
        reportData.data(),
        IO_READ_FLAG_DROP_OLD_REPORTS );
    if( res != CC_OK && res != CC_READ_PENDING )
    {
        DebugPrint("Dummy ReadIoStream failed %d\n", res);
        return;
    }
}